

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandXSat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  long lVar6;
  char *format;
  long lVar7;
  xSAT_Solver_t *p;
  timespec ts;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  xSAT_Solver_t *local_48;
  timespec local_40;
  
  local_54 = 0;
  Extra_UtilGetoptReset();
  local_58 = 0;
  local_50 = 0;
  local_4c = 0;
  local_5c = 0;
  bVar1 = false;
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"CILDEhv"), iVar4 = globalUtilOptind, iVar2 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    switch(iVar2) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0026dd1a:
        Abc_Print(-1,pcVar5);
        goto switchD_0026daa7_caseD_46;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_5c = uVar3;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-D\" should be followed by an integer.\n";
        goto LAB_0026dd1a;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_50 = uVar3;
      break;
    case 0x45:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-E\" should be followed by an integer.\n";
        goto LAB_0026dd1a;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_4c = uVar3;
      break;
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
      goto switchD_0026daa7_caseD_46;
    case 0x49:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_0026dd1a;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_54 = uVar3;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_0026dd1a;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_58 = uVar3;
      break;
    default:
      if ((iVar2 == -1) && (globalUtilOptind + 1 == argc)) {
        pcVar5 = argv[globalUtilOptind];
        __stream = fopen(pcVar5,"rb");
        if (__stream == (FILE *)0x0) {
          printf("Cannot open file \"%s\" for writing.\n",pcVar5);
        }
        else {
          xSAT_SolverParseDimacs((FILE *)__stream,&local_48);
          iVar4 = clock_gettime(3,&local_40);
          if (iVar4 < 0) {
            lVar6 = 1;
          }
          else {
            lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
            lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
          }
          iVar4 = xSAT_SolverSolve(local_48);
          fclose(__stream);
          xSAT_SolverPrintStats(local_48);
          pcVar5 = "UNSATISFIABLE  ";
          if (iVar4 == 1) {
            pcVar5 = "SATISFIABLE    ";
          }
          format = "UNDECIDED      ";
          if (iVar4 != 0) {
            format = pcVar5;
          }
          Abc_Print(1,format);
          iVar4 = clock_gettime(3,&local_40);
          if (iVar4 < 0) {
            lVar7 = -1;
          }
          else {
            lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
          }
          Abc_Print(1,"%s =","Time");
          Abc_Print(1,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
          xSAT_SolverDestroy(local_48);
        }
        return 0;
      }
      goto switchD_0026daa7_caseD_46;
    }
    globalUtilOptind = iVar4 + 1;
  } while (-1 < (int)uVar3);
switchD_0026daa7_caseD_46:
  Abc_Print(-2,"usage: xsat [-CILDE num] [-hv]<file>.cnf\n");
  Abc_Print(-2,"\t         solves the combinational miter using SAT solver MiniSat-1.14\n");
  Abc_Print(-2,"\t         derives CNF from the current network and leaves it unchanged\n");
  Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",(ulong)local_5c);
  Abc_Print(-2,"\t-I num : limit on the number of inspections [default = %d]\n",(ulong)local_54);
  Abc_Print(-2,"\t-L num : starting value for learned clause removal [default = %d]\n",
            (ulong)local_58);
  Abc_Print(-2,"\t-D num : delta value for learned clause removal [default = %d]\n",(ulong)local_50)
  ;
  Abc_Print(-2,"\t-E num : ratio percentage for learned clause removal [default = %d]\n",
            (ulong)local_4c);
  pcVar5 = "yes";
  if (!bVar1) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandXSat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    abctime clk;
    int c;
    int fVerbose   = 0;
    int nConfLimit = 0;
    int nInsLimit  = 0;
    int nLearnedStart = 0;
    int nLearnedDelta = 0;
    int nLearnedPerce = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CILDEhv" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInsLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsLimit < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedStart < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedDelta < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedPerce < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        case 'v':
            fVerbose ^= 1;
            break;

        default:
            goto usage;
        }
    }

    if ( argc == globalUtilOptind + 1 )
    {
        char * pFileName = argv[globalUtilOptind];
        xSAT_Solver_t * p;
        int status;

        FILE * pFile = fopen( pFileName, "rb" );
        if ( pFile == NULL )
        {
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
            return 0;
        }
        xSAT_SolverParseDimacs( pFile, &p );

        clk = Abc_Clock();
        status = xSAT_SolverSolve( p );
        fclose( pFile );

        xSAT_SolverPrintStats( p );
        if ( status == 0 )
            Abc_Print( 1, "UNDECIDED      " );
        else if ( status == 1 )
            Abc_Print( 1, "SATISFIABLE    " );
        else
            Abc_Print( 1, "UNSATISFIABLE  " );

        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

        xSAT_SolverDestroy( p );
        return 0;
    }

usage:
    Abc_Print( -2, "usage: xsat [-CILDE num] [-hv]<file>.cnf\n" );
    Abc_Print( -2, "\t         solves the combinational miter using SAT solver MiniSat-1.14\n" );
    Abc_Print( -2, "\t         derives CNF from the current network and leaves it unchanged\n" );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n",    nConfLimit );
    Abc_Print( -2, "\t-I num : limit on the number of inspections [default = %d]\n", nInsLimit );
    Abc_Print( -2, "\t-L num : starting value for learned clause removal [default = %d]\n", nLearnedStart );
    Abc_Print( -2, "\t-D num : delta value for learned clause removal [default = %d]\n", nLearnedDelta );
    Abc_Print( -2, "\t-E num : ratio percentage for learned clause removal [default = %d]\n", nLearnedPerce );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}